

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O3

int nn_bus_send(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  sVar3 = nn_chunkref_size(&msg->sphdr);
  iVar2 = -0x16;
  if (sVar3 == 0) {
    iVar1 = nn_xbus_send(self,msg);
    iVar2 = 0;
    if (iVar1 != 0) {
      nn_bus_send_cold_1();
    }
  }
  return iVar2;
}

Assistant:

static int nn_bus_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_bus *bus;

    bus = nn_cont (self, struct nn_bus, xbus.sockbase);

    /*  Check for malformed messages. */
    if (nn_chunkref_size (&msg->sphdr))
        return -EINVAL;

    /*  Send the message. */
    rc = nn_xbus_send (&bus->xbus.sockbase, msg);
    errnum_assert (rc == 0, -rc);

    return 0;
}